

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Future.cpp
# Opt level: O3

void __thiscall
Future<void>::Private::ThreadPool::ThreadPool
          (ThreadPool *this,usize minThreads,usize maxThreads,usize queueSize)

{
  Item *pIVar1;
  ulong uVar2;
  Node *pNVar3;
  usize *puVar4;
  usize uVar5;
  
  this->_minThreads = minThreads;
  this->_maxThreads = maxThreads;
  uVar2 = queueSize - 1 >> 1 | queueSize - 1;
  uVar2 = uVar2 >> 2 | uVar2;
  uVar2 = uVar2 >> 4 | uVar2;
  uVar2 = uVar2 >> 8 | uVar2;
  uVar2 = uVar2 >> 0x10 | uVar2;
  (this->_queue)._capacityMask = uVar2;
  (this->_queue)._capacity = uVar2 + 1;
  pNVar3 = (Node *)operator_new__((uVar2 + 1) * 0x20);
  (this->_queue)._queue = pNVar3;
  if (uVar2 != 0xffffffffffffffff) {
    puVar4 = &pNVar3->head;
    uVar5 = 0;
    do {
      puVar4[-1] = uVar5;
      *puVar4 = 0xffffffffffffffff;
      uVar5 = uVar5 + 1;
      puVar4 = puVar4 + 4;
    } while (uVar2 + 1 != uVar5);
  }
  (this->_queue)._tail = 0;
  (this->_queue)._head = 0;
  Signal::Signal(&(this->_dequeuedSignal)._signal,false);
  (this->_dequeuedSignal)._state = 0;
  Signal::Signal(&(this->_enqueuedSignal)._signal,false);
  (this->_enqueuedSignal)._state = 0;
  this->_pushedJobs = 0;
  this->_processedJobs = 0;
  this->_threadCount = 0;
  Mutex::Mutex(&this->_mutex);
  pIVar1 = &(this->_threads).endItem;
  (this->_threads)._end.item = pIVar1;
  (this->_threads)._begin.item = pIVar1;
  (this->_threads)._size = 0;
  (this->_threads).endItem.prev = (Item *)0x0;
  (this->_threads).endItem.next = (Item *)0x0;
  (this->_threads).freeItem = (Item *)0x0;
  (this->_threads).blocks = (ItemBlock *)0x0;
  if (this->_maxThreads < 3) {
    this->_maxThreads = 3;
  }
  return;
}

Assistant:

ThreadPool(usize minThreads = 0, usize maxThreads = System::getProcessorCount(), usize queueSize = 0x100)
        : _minThreads(minThreads), _maxThreads(maxThreads), _queue(queueSize), _pushedJobs(0), _processedJobs(0), _threadCount(0)
    {
      if (_maxThreads < 3)
        _maxThreads = 3;
    }